

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void __thiscall Executor::visit(Executor *this,ReturnNode *node)

{
  ExpressionNode *pEVar1;
  tuple<Value_*,_std::default_delete<Value>_> in_RAX;
  pointer *__ptr;
  __uniq_ptr_impl<Value,_std::default_delete<Value>_> local_18;
  
  pEVar1 = (node->value_)._M_t.
           super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
           super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  local_18._M_t.super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
  super__Head_base<0UL,_Value_*,_false>._M_head_impl =
       (tuple<Value_*,_std::default_delete<Value>_>)
       (tuple<Value_*,_std::default_delete<Value>_>)
       in_RAX.super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
       super__Head_base<0UL,_Value_*,_false>._M_head_impl;
  (**(code **)((long)(pEVar1->super_Node)._vptr_Node + 0x10))(pEVar1,this);
  (*((this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
     super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
     super__Head_base<0UL,_Value_*,_false>._M_head_impl)->_vptr_Value[2])(&local_18);
  std::
  deque<std::unique_ptr<Value,std::default_delete<Value>>,std::allocator<std::unique_ptr<Value,std::default_delete<Value>>>>
  ::emplace_back<std::unique_ptr<Value,std::default_delete<Value>>>
            ((deque<std::unique_ptr<Value,std::default_delete<Value>>,std::allocator<std::unique_ptr<Value,std::default_delete<Value>>>>
              *)&this->returnStack_,(unique_ptr<Value,_std::default_delete<Value>_> *)&local_18);
  if (local_18._M_t.super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
      super__Head_base<0UL,_Value_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>)0x0) {
    (**(code **)(*(long *)local_18._M_t.super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>
                          .super__Head_base<0UL,_Value_*,_false>._M_head_impl + 8))();
  }
  return;
}

Assistant:

void Executor::visit(const ReturnNode& node)
{
  node.getValue().accept(*this);
  auto returnedValue = value_->clone();
  returnStack_.emplace(std::move(returnedValue));
}